

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl::
~IncomingRpcMessageImpl(IncomingRpcMessageImpl *this)

{
  UnalignedFlatArrayMessageReader::~UnalignedFlatArrayMessageReader
            (&(this->message).super_UnalignedFlatArrayMessageReader);
  kj::Array<capnp::word>::~Array(&this->data);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

IncomingRpcMessageImpl(kj::Array<word> data)
          : data(kj::mv(data)),
            message(this->data) {}